

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O2

void __thiscall
arangodb::velocypack::Builder::sortObjectIndexLong
          (Builder *this,uint8_t *objBase,iterator indexStart,iterator indexEnd)

{
  long *plVar1;
  default_delete<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>
  *this_00;
  long lVar2;
  _Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
  *this_01;
  undefined8 *puVar3;
  pointer pSVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  _Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
  *p_Var8;
  _Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
  *p_Var9;
  long *plVar10;
  _Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
  *p_Var11;
  vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_> *__ptr
  ;
  _Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
  *this_02;
  __normal_iterator<(anonymous_namespace)::SortEntry_*,_std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>
  __i;
  size_t __n;
  long lVar12;
  pointer __p;
  long *in_FS_OFFSET;
  SortEntry e;
  
  __ptr = (vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
           *)objBase;
  __tls_init();
  plVar1 = (long *)(*in_FS_OFFSET + -0x18);
  __tls_init();
  if (*plVar1 == 0) {
    puVar3 = (undefined8 *)operator_new(0x18);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3[2] = 0;
    __tls_init();
    e.nameStart = (uint8_t *)0x0;
    this_00 = (default_delete<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>
               *)*plVar1;
    *plVar1 = (long)puVar3;
    if (this_00 !=
        (default_delete<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>
         *)0x0) {
      std::
      default_delete<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>
      ::operator()(this_00,__ptr);
    }
    std::
    unique_ptr<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>,_std::default_delete<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>,_std::default_delete<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>_>
                   *)&e);
    plVar10 = (long *)*plVar1;
  }
  else {
    __tls_init();
    plVar10 = (long *)*plVar1;
    if (plVar10[1] != *plVar10) {
      plVar10[1] = *plVar10;
    }
  }
  p_Var11 = (_Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
             *)((long)indexEnd._M_current - (long)indexStart._M_current >> 3);
  p_Var9 = (_Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
            *)0x20;
  if ((_Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
       *)0x20 < p_Var11) {
    p_Var9 = p_Var11;
  }
  if (p_Var11 < (_Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
                 *)0x555555555555556) {
    lVar7 = *plVar10;
    if ((_Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
         *)((plVar10[2] - lVar7) / 0x18) < p_Var9) {
      lVar2 = plVar10[1];
      pSVar4 = std::
               _Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
               ::_M_allocate(p_Var9,0x18);
      p_Var8 = (_Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
                *)*plVar10;
      if (0 < plVar10[1] - (long)p_Var8) {
        memmove(pSVar4,p_Var8,plVar10[1] - (long)p_Var8);
      }
      std::
      _Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
      ::_M_deallocate(p_Var8,(pointer)((plVar10[2] - (long)p_Var8) / 0x18),
                      (plVar10[2] - (long)p_Var8) % 0x18);
      *plVar10 = (long)pSVar4;
      plVar10[1] = (lVar2 - lVar7) + (long)pSVar4;
      plVar10[2] = (long)(pSVar4 + (long)p_Var9);
    }
    p_Var9 = (_Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
              *)0x0;
    do {
      if (p_Var11 == p_Var9) {
        lVar7 = *(long *)*plVar1;
        lVar2 = ((long *)*plVar1)[1];
        if (lVar7 != lVar2) {
          uVar6 = (lVar2 - lVar7) / 0x18;
          lVar12 = 0x3f;
          if (uVar6 != 0) {
            for (; uVar6 >> lVar12 == 0; lVar12 = lVar12 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<(anonymous_namespace)::SortEntry*,std::vector<(anonymous_namespace)::SortEntry,std::allocator<(anonymous_namespace)::SortEntry>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<arangodb::velocypack::Builder::sortObjectIndexLong(unsigned_char*,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>)const::__0>>
                    (lVar7,lVar2,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
          if (lVar2 - lVar7 < 0x181) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::SortEntry*,std::vector<(anonymous_namespace)::SortEntry,std::allocator<(anonymous_namespace)::SortEntry>>>,__gnu_cxx::__ops::_Iter_comp_iter<arangodb::velocypack::Builder::sortObjectIndexLong(unsigned_char*,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>)const::__0>>
                      (lVar7,lVar2);
          }
          else {
            lVar12 = lVar7 + 0x180;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::SortEntry*,std::vector<(anonymous_namespace)::SortEntry,std::allocator<(anonymous_namespace)::SortEntry>>>,__gnu_cxx::__ops::_Iter_comp_iter<arangodb::velocypack::Builder::sortObjectIndexLong(unsigned_char*,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>)const::__0>>
                      (lVar7,lVar12);
            for (; lVar12 != lVar2; lVar12 = lVar12 + 0x18) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::SortEntry*,std::vector<(anonymous_namespace)::SortEntry,std::allocator<(anonymous_namespace)::SortEntry>>>,__gnu_cxx::__ops::_Val_comp_iter<arangodb::velocypack::Builder::sortObjectIndexLong(unsigned_char*,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>)const::__0>>
                        (lVar12);
            }
          }
        }
        plVar1 = (long *)*plVar1;
        lVar7 = 2;
        for (p_Var9 = (_Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
                       *)0x0; p_Var11 != p_Var9;
            p_Var9 = (_Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
                      *)((long)&(p_Var9->_M_impl).super__Vector_impl_data._M_start + 1)) {
          indexStart._M_current[(long)p_Var9] = *(unsigned_long *)(*plVar1 + lVar7 * 8);
          lVar7 = lVar7 + 3;
        }
        return;
      }
      e.offset = indexStart._M_current[(long)p_Var9];
      e.nameStart = anon_unknown.dwarf_59ea::findAttrName(objBase + e.offset,&e.nameSize);
      puVar3 = (undefined8 *)*plVar1;
      p_Var8 = (_Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
                *)puVar3[1];
      if (p_Var8 == (_Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
                     *)puVar3[2]) {
        this_01 = (_Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
                   *)*puVar3;
        __n = (long)p_Var8 - (long)this_01;
        if (__n == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar5 = (long)__n / 0x18;
        uVar6 = uVar5;
        if (p_Var8 == this_01) {
          uVar6 = 1;
        }
        p_Var8 = (_Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
                  *)(uVar6 + uVar5);
        if ((_Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
             *)0x555555555555554 < p_Var8) {
          p_Var8 = (_Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
                    *)0x555555555555555;
        }
        this_02 = (_Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
                   *)0x555555555555555;
        if (!CARRY8(uVar6,uVar5)) {
          this_02 = p_Var8;
        }
        pSVar4 = std::
                 _Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
                 ::_M_allocate(this_02,0x555555555555555);
        *(undefined8 *)((long)pSVar4 + __n) = e.nameStart;
        ((undefined8 *)((long)pSVar4 + __n))[1] = e.nameSize;
        *(uint64_t *)((long)pSVar4 + __n + 0x10) = e.offset;
        if (0 < (long)__n) {
          memmove(pSVar4,this_01,__n);
        }
        std::
        _Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
        ::_M_deallocate(this_01,(pointer)((puVar3[2] - (long)this_01) / 0x18),
                        (puVar3[2] - (long)this_01) % 0x18);
        *puVar3 = pSVar4;
        puVar3[1] = (long)pSVar4 + __n + 0x18;
        puVar3[2] = pSVar4 + (long)this_02;
      }
      else {
        (p_Var8->_M_impl).super__Vector_impl_data._M_end_of_storage = (pointer)e.offset;
        (p_Var8->_M_impl).super__Vector_impl_data._M_start = (pointer)e.nameStart;
        (p_Var8->_M_impl).super__Vector_impl_data._M_finish = (pointer)e.nameSize;
        puVar3[1] = puVar3[1] + 0x18;
      }
      p_Var9 = (_Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
                *)((long)&(p_Var9->_M_impl).super__Vector_impl_data._M_start + 1);
    } while( true );
  }
  std::__throw_length_error("vector::reserve");
}

Assistant:

void Builder::sortObjectIndexLong(
    uint8_t* objBase, std::vector<ValueLength>::iterator indexStart,
    std::vector<ValueLength>::iterator indexEnd) const {
#ifndef VELOCYPACK_NO_THREADLOCALS
  std::unique_ptr<std::vector<SortEntry>>& tmp = ::sortEntries;

  // start with clean sheet in case the previous run left something
  // in the vector (e.g. when bailing out with an exception)
  if (::sortEntries == nullptr) {
    ::sortEntries = std::make_unique<std::vector<SortEntry>>();
  } else {
    ::sortEntries->clear();
  }
#else
  auto tmp = std::make_unique<std::vector<SortEntry>>();
#endif

  std::size_t const n = std::distance(indexStart, indexEnd);
  VELOCYPACK_ASSERT(n > 1);
  tmp->reserve(std::max(::minSortEntriesAllocation, n));
  for (std::size_t i = 0; i < n; i++) {
    SortEntry e;
    e.offset = indexStart[i];
    e.nameStart = ::findAttrName(objBase + e.offset, e.nameSize);
    tmp->push_back(e);
  }
  VELOCYPACK_ASSERT(tmp->size() == n);
  std::sort(tmp->begin(), tmp->end(),
            [](SortEntry const& a, SortEntry const& b)
#ifdef VELOCYPACK_64BIT
                noexcept
#endif
            {
              // return true iff a < b:
              uint64_t sizea = a.nameSize;
              uint64_t sizeb = b.nameSize;
              std::size_t const compareLength =
                  checkOverflow((std::min)(sizea, sizeb));
              int res = std::memcmp(a.nameStart, b.nameStart, compareLength);

              return (res < 0 || (res == 0 && sizea < sizeb));
            });

  // copy back the sorted offsets
  for (std::size_t i = 0; i < n; i++) {
    indexStart[i] = (*tmp)[i].offset;
  }
}